

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O2

void __thiscall
wasm::
AnalysisChecker<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
::checkMonotonicity(AnalysisChecker<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
                    *this,BasicBlock *bb,Element *first,Element *second,Element *firstResult,
                   Element *secondResult)

{
  LatticeComparison LVar1;
  LatticeComparison LVar2;
  stringstream local_378 [8];
  stringstream ss;
  undefined1 local_368 [768];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  __node_base local_48;
  Element *local_40;
  Element *local_38;
  
  local_48._M_nxt = (_Hash_node_base *)bb;
  local_38 = second;
  LVar1 = analysis::FiniteIntPowersetLattice::compare(&this->lattice->intLattice,first,second);
  local_40 = secondResult;
  LVar2 = analysis::FiniteIntPowersetLattice::compare
                    (&this->lattice->intLattice,firstResult,secondResult);
  if (LVar1 != NO_RELATION) {
    if (LVar1 == GREATER) {
      LVar2 = LVar2 & ~LESS;
    }
    else {
      if (LVar1 == LESS) {
        if (LVar2 - EQUAL < 2) {
          return;
        }
        goto LAB_001ba177;
      }
      if (LVar1 != EQUAL) goto LAB_001ba177;
    }
    if (LVar2 != EQUAL) {
LAB_001ba177:
      std::__cxx11::stringstream::stringstream(local_378);
      printFailureInfo(this,(ostream *)local_368);
      std::operator<<((ostream *)local_368,"Elements ");
      analysis::FiniteIntPowersetLattice::Element::print(first,(ostream *)local_368);
      std::operator<<((ostream *)local_368," -> ");
      analysis::FiniteIntPowersetLattice::Element::print(firstResult,(ostream *)local_368);
      std::operator<<((ostream *)local_368," and ");
      analysis::FiniteIntPowersetLattice::Element::print(local_38,(ostream *)local_368);
      std::operator<<((ostream *)local_368," -> ");
      analysis::FiniteIntPowersetLattice::Element::print(local_40,(ostream *)local_368);
      std::operator<<((ostream *)local_368,
                      "\n show that the transfer function is not monotone when given the input:\n");
      wasm::analysis::BasicBlock::print((ostream *)local_48._M_nxt,(Module *)local_368,0);
      std::operator<<((ostream *)local_368,"\n");
      Fatal::Fatal((Fatal *)(local_368 + 0x178));
      std::__cxx11::stringbuf::str();
      Fatal::operator<<((Fatal *)(local_368 + 0x178),&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      Fatal::~Fatal((Fatal *)(local_368 + 0x178));
    }
  }
  return;
}

Assistant:

void checkMonotonicity(const BasicBlock& bb,
                         typename L::Element& first,
                         typename L::Element& second,
                         typename L::Element& firstResult,
                         typename L::Element& secondResult) {
    LatticeComparison beforeCmp = lattice.compare(first, second);
    LatticeComparison afterCmp = lattice.compare(firstResult, secondResult);

    // Cases in which monotonicity is preserved.
    if (beforeCmp == LatticeComparison::NO_RELATION) {
      // If there is no relation in the first place, we can't expect anything.
      return;
    } else if (beforeCmp == LatticeComparison::LESS &&
               (afterCmp == LatticeComparison::LESS ||
                afterCmp == LatticeComparison::EQUAL)) {
      // x < y and f(x) <= f(y)
      return;
    } else if (beforeCmp == LatticeComparison::GREATER &&
               (afterCmp == LatticeComparison::GREATER ||
                afterCmp == LatticeComparison::EQUAL)) {
      // x > y and f(x) >= f(y)
      return;
    } else if (beforeCmp == LatticeComparison::EQUAL &&
               afterCmp == LatticeComparison::EQUAL) {
      // x = y and f(x) = f(y)
      return;
    }

    std::stringstream ss;
    printFailureInfo(ss);

    ss << "Elements ";
    first.print(ss);
    ss << " -> ";
    firstResult.print(ss);
    ss << " and ";
    second.print(ss);
    ss << " -> ";
    secondResult.print(ss);
    ss << "\n show that the transfer function is not monotone when given the "
          "input:\n";
    bb.print(ss);
    ss << "\n";

    Fatal() << ss.str();
  }